

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::scarveholes(tetgenmesh *this,int holes,double *holelist)

{
  uint *puVar1;
  shellface ppdVar2;
  ulong uVar3;
  undefined8 *puVar4;
  memorypool *pmVar5;
  locateresult lVar6;
  char *pcVar7;
  arraypool **ppaVar8;
  arraypool *paVar9;
  uint uVar10;
  uint uVar11;
  shellface *pppdVar12;
  double *searchpt;
  ulong uVar13;
  undefined4 in_register_00000034;
  long lVar14;
  long lVar15;
  int iVar16;
  shellface *pppdVar17;
  int iVar18;
  face local_70;
  arraypool **local_60;
  tetgenmesh *local_58;
  arraypool **local_50;
  undefined8 local_48;
  double *local_40;
  long local_38;
  
  local_48 = CONCAT44(in_register_00000034,holes);
  local_70.sh = (shellface *)0x0;
  local_70.shver = 0;
  puVar1 = (uint *)((long)(this->recentsh).sh + (long)this->shmarkindex * 4 + 4);
  *puVar1 = *puVar1 | 2;
  local_60 = &this->caveshlist;
  paVar9 = this->caveshlist;
  local_40 = holelist;
  pcVar7 = arraypool::getblock(paVar9,(int)paVar9->objects);
  lVar14 = (long)paVar9->objectbytes * ((long)paVar9->objectsperblock - 1U & paVar9->objects);
  paVar9->objects = paVar9->objects + 1;
  *(shellface **)(pcVar7 + lVar14) = (this->recentsh).sh;
  *(int *)(pcVar7 + lVar14 + 8) = (this->recentsh).shver;
  paVar9 = this->caveshlist;
  pppdVar17 = local_70.sh;
  uVar11 = local_70.shver;
  local_58 = this;
  if (0 < paVar9->objects) {
    local_50 = &this->caveshbdlist;
    lVar14 = 0;
    do {
      pppdVar17 = *(shellface **)
                   (paVar9->toparray[(uint)lVar14 >> ((byte)paVar9->log2objectsperblock & 0x1f)] +
                   (long)paVar9->objectbytes *
                   (long)(int)(paVar9->objectsperblockmark & (uint)lVar14));
      iVar18 = 3;
      uVar11 = 0;
      local_38 = lVar14;
      do {
        ppdVar2 = pppdVar17[(int)uVar11 >> 1];
        pppdVar12 = (shellface *)((ulong)ppdVar2 & 0xfffffffffffffff8);
        if (pppdVar12 == (shellface *)0x0) {
          if (pppdVar17[(long)((int)uVar11 >> 1) + 6] == (shellface)0x0) {
            uVar10 = *(uint *)((long)pppdVar17 + (long)this->shmarkindex * 4 + 4);
            if ((uVar10 & 1) == 0) {
              *(uint *)((long)pppdVar17 + (long)this->shmarkindex * 4 + 4) = uVar10 | 1;
              ppaVar8 = local_50;
              pppdVar12 = pppdVar17;
              uVar10 = uVar11;
              goto LAB_0012ef8f;
            }
          }
        }
        else {
          uVar10 = *(uint *)((long)pppdVar12 + (long)this->shmarkindex * 4 + 4);
          if ((uVar10 & 2) == 0) {
            *(uint *)((long)pppdVar12 + (long)this->shmarkindex * 4 + 4) = uVar10 | 2;
            ppaVar8 = local_60;
            uVar10 = (uint)ppdVar2 & 7;
LAB_0012ef8f:
            paVar9 = *ppaVar8;
            pcVar7 = arraypool::getblock(paVar9,(int)paVar9->objects);
            lVar14 = (long)paVar9->objectbytes *
                     ((long)paVar9->objectsperblock - 1U & paVar9->objects);
            paVar9->objects = paVar9->objects + 1;
            *(shellface **)(pcVar7 + lVar14) = pppdVar12;
            *(uint *)(pcVar7 + lVar14 + 8) = uVar10;
            this = local_58;
          }
        }
        uVar11 = snextpivot[(int)uVar11];
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
      lVar14 = local_38 + 1;
      paVar9 = *local_60;
    } while (lVar14 < paVar9->objects);
  }
  iVar18 = (int)local_48;
  local_70.sh = pppdVar17;
  local_70.shver = uVar11;
  if (0 < iVar18) {
    iVar16 = 0;
    searchpt = local_40;
    do {
      local_70.sh = (this->recentsh).sh;
      local_70.shver = (this->recentsh).shver;
      lVar6 = slocate(this,searchpt,&local_70,1,1,0);
      pppdVar17 = local_70.sh;
      if (lVar6 != OUTSIDE) {
        puVar1 = (uint *)((long)local_70.sh + (long)local_58->shmarkindex * 4 + 4);
        *puVar1 = *puVar1 | 1;
        paVar9 = local_58->caveshbdlist;
        pcVar7 = arraypool::getblock(paVar9,(int)paVar9->objects);
        lVar14 = (long)paVar9->objectbytes * ((long)paVar9->objectsperblock - 1U & paVar9->objects);
        paVar9->objects = paVar9->objects + 1;
        *(shellface **)(pcVar7 + lVar14) = pppdVar17;
        *(int *)(pcVar7 + lVar14 + 8) = local_70.shver;
      }
      searchpt = searchpt + 3;
      iVar16 = iVar16 + 3;
      this = local_58;
    } while (iVar16 < iVar18 * 3);
  }
  paVar9 = this->caveshbdlist;
  if (0 < paVar9->objects) {
    local_50 = (arraypool **)0x0;
    do {
      lVar14 = *(long *)(paVar9->toparray
                         [(uint)local_50 >> ((byte)paVar9->log2objectsperblock & 0x1f)] +
                        (long)paVar9->objectbytes *
                        (long)(int)(paVar9->objectsperblockmark & (uint)local_50));
      iVar16 = 3;
      iVar18 = 0;
      do {
        uVar3 = *(ulong *)(lVar14 + (long)(iVar18 >> 1) * 8);
        uVar13 = uVar3 & 0xfffffffffffffff8;
        if (uVar13 != 0) {
          uVar11 = (uint)uVar3;
          if (*(long *)(lVar14 + 0x30 + (long)(iVar18 >> 1) * 8) == 0) {
            uVar10 = *(uint *)(uVar13 + 4 + (long)this->shmarkindex * 4);
            if ((uVar10 & 1) == 0) {
              *(uint *)(uVar13 + 4 + (long)this->shmarkindex * 4) = uVar10 | 1;
              paVar9 = this->caveshbdlist;
              pcVar7 = arraypool::getblock(paVar9,(int)paVar9->objects);
              lVar15 = (long)paVar9->objectbytes *
                       ((long)paVar9->objectsperblock - 1U & paVar9->objects);
              paVar9->objects = paVar9->objects + 1;
              *(ulong *)(pcVar7 + lVar15) = uVar13;
              *(uint *)(pcVar7 + lVar15 + 8) = uVar11 & 7;
              this = local_58;
            }
          }
          else {
            *(undefined8 *)(uVar13 + (ulong)(uVar11 & 6) * 4) = 0;
          }
        }
        iVar18 = snextpivot[iVar18];
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
      local_50 = (arraypool **)((long)local_50 + 1);
      paVar9 = this->caveshbdlist;
    } while ((long)local_50 < paVar9->objects);
  }
  paVar9 = *local_60;
  if (0 < paVar9->objects) {
    lVar14 = 0;
    do {
      puVar4 = *(undefined8 **)
                (paVar9->toparray[(uint)lVar14 >> ((byte)paVar9->log2objectsperblock & 0x1f)] +
                (long)paVar9->objectbytes * (long)(int)(paVar9->objectsperblockmark & (uint)lVar14))
      ;
      uVar11 = *(uint *)((long)puVar4 + (long)this->shmarkindex * 4 + 4);
      if ((uVar11 & 1) == 0) {
        *(uint *)((long)puVar4 + (long)this->shmarkindex * 4 + 4) = uVar11 & 0xfffffffc;
      }
      else {
        pmVar5 = this->subfaces;
        puVar4[3] = 0;
        *puVar4 = pmVar5->deaditemstack;
        pmVar5->deaditemstack = puVar4;
        pmVar5->items = pmVar5->items + -1;
      }
      lVar14 = lVar14 + 1;
      paVar9 = *local_60;
    } while (lVar14 < paVar9->objects);
  }
  paVar9->objects = 0;
  this->caveshbdlist->objects = 0;
  return;
}

Assistant:

void tetgenmesh::scarveholes(int holes, REAL* holelist)
{
  face *parysh, searchsh, neighsh;
  enum locateresult loc;
  int i, j;

  // Get all triangles. Infect unprotected convex hull triangles. 
  smarktest(recentsh);
  caveshlist->newindex((void **) &parysh);
  *parysh = recentsh;
  for (i = 0; i < caveshlist->objects; i++) {
    parysh = (face *) fastlookup(caveshlist, i);
    searchsh = *parysh;
    searchsh.shver = 0;
    for (j = 0; j < 3; j++) {
      spivot(searchsh, neighsh);
      // Is this side on the convex hull?
      if (neighsh.sh != NULL) {
        if (!smarktested(neighsh)) {
          smarktest(neighsh);
          caveshlist->newindex((void **) &parysh);
          *parysh = neighsh;
        }
      } else {
        // A hull side. Check if it is protected by a segment.
        if (!isshsubseg(searchsh)) {
          // Not protected. Save this face.
          if (!sinfected(searchsh)) {
            sinfect(searchsh);
            caveshbdlist->newindex((void **) &parysh);
            *parysh = searchsh;
          }
        }
      }
      senextself(searchsh);
    }
  }

  // Infect the triangles in the holes.
  for (i = 0; i < 3 * holes; i += 3) {
    searchsh = recentsh;
    loc = slocate(&(holelist[i]), &searchsh, 1, 1, 0);
    if (loc != OUTSIDE) {
      sinfect(searchsh);
      caveshbdlist->newindex((void **) &parysh);
      *parysh = searchsh;
    }
  }

  // Find and infect all exterior triangles.
  for (i = 0; i < caveshbdlist->objects; i++) {
    parysh = (face *) fastlookup(caveshbdlist, i);
    searchsh = *parysh;
    searchsh.shver = 0;
    for (j = 0; j < 3; j++) {
      spivot(searchsh, neighsh);
      if (neighsh.sh != NULL) {
        if (!isshsubseg(searchsh)) {
          if (!sinfected(neighsh)) {
            sinfect(neighsh);
            caveshbdlist->newindex((void **) &parysh);
            *parysh = neighsh;
          }
        } else {
          sdissolve(neighsh); // Disconnect a protected face.
        }
      }
      senextself(searchsh);
    }
  }

  // Delete exterior triangles, unmark interior triangles.
  for (i = 0; i < caveshlist->objects; i++) {
    parysh = (face *) fastlookup(caveshlist, i);
    if (sinfected(*parysh)) {
      shellfacedealloc(subfaces, parysh->sh);
    } else {
      sunmarktest(*parysh);
    }
  }

  caveshlist->restart();
  caveshbdlist->restart();
}